

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O3

void __thiscall EVPTest_WycheproofRSAPSS_Test::TestBody(EVPTest_WycheproofRSAPSS_Test *this)

{
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_2048_sha1_mgf1_20_test.txt");
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_2048_sha256_mgf1_0_test.txt");
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_2048_sha256_mgf1_32_test.txt")
  ;
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_3072_sha256_mgf1_32_test.txt")
  ;
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_4096_sha256_mgf1_32_test.txt")
  ;
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_4096_sha512_mgf1_32_test.txt")
  ;
  RunWycheproofVerifyTest("third_party/wycheproof_testvectors/rsa_pss_misc_test.txt");
  return;
}

Assistant:

TEST(EVPTest, WycheproofRSAPSS) {
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/rsa_pss_2048_sha1_mgf1_20_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/rsa_pss_2048_sha256_mgf1_0_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/"
      "rsa_pss_2048_sha256_mgf1_32_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/"
      "rsa_pss_3072_sha256_mgf1_32_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/"
      "rsa_pss_4096_sha256_mgf1_32_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/"
      "rsa_pss_4096_sha512_mgf1_32_test.txt");
  RunWycheproofVerifyTest(
      "third_party/wycheproof_testvectors/rsa_pss_misc_test.txt");
}